

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O2

PropertyIndex __thiscall
Js::RootObjectBase::GetRootPropertyIndex(RootObjectBase *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  PropertyRecord *pPVar6;
  char *message;
  char *error;
  uint lineNumber;
  
  if ((uint)propertyId < 0x10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(!Js::IsInternalPropertyId(propertyId))";
    message = "!Js::IsInternalPropertyId(propertyId)";
    lineNumber = 0xd1;
  }
  else {
    if (propertyId != -1) goto LAB_00be5604;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(propertyId != Constants::NoProperty)";
    message = "propertyId != Constants::NoProperty";
    lineNumber = 0xd2;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                              ,lineNumber,error,message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00be5604:
  pDVar5 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  pPVar6 = ScriptContext::GetPropertyName
                     ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                      propertyId);
  iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x1e])(pDVar5,pPVar6);
  return (PropertyIndex)iVar3;
}

Assistant:

PropertyIndex
    RootObjectBase::GetRootPropertyIndex(PropertyId propertyId)
    {
        Assert(!Js::IsInternalPropertyId(propertyId));
        Assert(propertyId != Constants::NoProperty);
        return GetTypeHandler()->GetRootPropertyIndex(this->GetScriptContext()->GetPropertyName(propertyId));
    }